

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void __thiscall Log::Add(Log *this,string *prefix,string *message)

{
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *message_local;
  string *prefix_local;
  Log *this_local;
  
  local_20 = message;
  message_local = prefix;
  prefix_local = &this->_logText;
  std::operator+((char *)local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c29b1);
  std::operator+(local_60,(char *)local_80);
  std::operator+(local_40,local_60);
  Add(this,local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

void Log::Add(string prefix, string message) {
  Add("[" + prefix + "] " + message);
}